

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

bool duckdb::DecimalDecimalCastSwitch<int,duckdb::NumericHelper>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  PhysicalType PVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  NotImplementedException *pNVar5;
  allocator local_61;
  idx_t local_60;
  CastParameters *local_58;
  string local_50;
  
  local_60 = count;
  local_58 = parameters;
  bVar2 = DecimalType::GetScale(&source->type);
  bVar3 = DecimalType::GetScale(&result->type);
  LogicalType::Verify(&source->type);
  LogicalType::Verify(&result->type);
  PVar1 = (result->type).physical_type_;
  if (bVar2 <= bVar3) {
    if (PVar1 == INT128) {
      bVar4 = TemplatedDecimalScaleUp<int,duckdb::hugeint_t,duckdb::NumericHelper,duckdb::Hugeint>
                        (source,result,local_60,local_58);
      return bVar4;
    }
    if (PVar1 == INT32) {
      bVar4 = TemplatedDecimalScaleUp<int,int,duckdb::NumericHelper,duckdb::NumericHelper>
                        (source,result,local_60,local_58);
      return bVar4;
    }
    if (PVar1 == INT64) {
      bVar4 = TemplatedDecimalScaleUp<int,long,duckdb::NumericHelper,duckdb::NumericHelper>
                        (source,result,local_60,local_58);
      return bVar4;
    }
    if (PVar1 == INT16) {
      bVar4 = TemplatedDecimalScaleUp<int,short,duckdb::NumericHelper,duckdb::NumericHelper>
                        (source,result,local_60,local_58);
      return bVar4;
    }
    pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Unimplemented internal type for decimal",&local_61);
    NotImplementedException::NotImplementedException(pNVar5,&local_50);
    __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (PVar1 == INT128) {
    bVar4 = TemplatedDecimalScaleDown<int,duckdb::hugeint_t,duckdb::NumericHelper>
                      (source,result,local_60,local_58);
    return bVar4;
  }
  if (PVar1 == INT32) {
    bVar4 = TemplatedDecimalScaleDown<int,int,duckdb::NumericHelper>
                      (source,result,local_60,local_58);
    return bVar4;
  }
  if (PVar1 == INT64) {
    bVar4 = TemplatedDecimalScaleDown<int,long,duckdb::NumericHelper>
                      (source,result,local_60,local_58);
    return bVar4;
  }
  if (PVar1 == INT16) {
    bVar4 = TemplatedDecimalScaleDown<int,short,duckdb::NumericHelper>
                      (source,result,local_60,local_58);
    return bVar4;
  }
  pNVar5 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Unimplemented internal type for decimal",&local_61);
  NotImplementedException::NotImplementedException(pNVar5,&local_50);
  __cxa_throw(pNVar5,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static bool DecimalDecimalCastSwitch(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
	auto source_scale = DecimalType::GetScale(source.GetType());
	auto result_scale = DecimalType::GetScale(result.GetType());
	source.GetType().Verify();
	result.GetType().Verify();

	// we need to either multiply or divide by the difference in scales
	if (result_scale >= source_scale) {
		// multiply
		switch (result.GetType().InternalType()) {
		case PhysicalType::INT16:
			return TemplatedDecimalScaleUp<SOURCE, int16_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT32:
			return TemplatedDecimalScaleUp<SOURCE, int32_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT64:
			return TemplatedDecimalScaleUp<SOURCE, int64_t, POWERS_SOURCE, NumericHelper>(source, result, count,
			                                                                              parameters);
		case PhysicalType::INT128:
			return TemplatedDecimalScaleUp<SOURCE, hugeint_t, POWERS_SOURCE, Hugeint>(source, result, count,
			                                                                          parameters);
		default:
			throw NotImplementedException("Unimplemented internal type for decimal");
		}
	} else {
		// divide
		switch (result.GetType().InternalType()) {
		case PhysicalType::INT16:
			return TemplatedDecimalScaleDown<SOURCE, int16_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT32:
			return TemplatedDecimalScaleDown<SOURCE, int32_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT64:
			return TemplatedDecimalScaleDown<SOURCE, int64_t, POWERS_SOURCE>(source, result, count, parameters);
		case PhysicalType::INT128:
			return TemplatedDecimalScaleDown<SOURCE, hugeint_t, POWERS_SOURCE>(source, result, count, parameters);
		default:
			throw NotImplementedException("Unimplemented internal type for decimal");
		}
	}
}